

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

char * stringcache_len_internal(StringCache *cache,char *str,uint len,int addmissing)

{
  char *__s1;
  StringBucket **ppSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  StringBucket *pSVar5;
  ulong uVar6;
  StringBucket *pSVar7;
  StringBucket *pSVar8;
  ulong __n;
  char *local_48;
  
  __n = (ulong)len;
  if (len == 0) {
    uVar3 = 5;
  }
  else {
    uVar3 = 0x1505;
    uVar6 = 0;
    do {
      uVar3 = (uint)(byte)str[uVar6] ^ uVar3 * 0x21;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
    uVar3 = uVar3 & 0xff;
  }
  uVar3 = cache->table_size + 0xff & uVar3;
  pSVar5 = (StringBucket *)0x0;
  pSVar8 = cache->hashtable[uVar3];
  do {
    if (pSVar8 == (StringBucket *)0x0) {
      if ((addmissing != 0) &&
         (pSVar5 = (StringBucket *)(*cache->m)(len + 0x11,cache->d), pSVar5 != (StringBucket *)0x0))
      {
        pSVar5->string = (char *)(pSVar5 + 1);
        memcpy(pSVar5 + 1,str,__n);
        *(undefined1 *)((long)&pSVar5[1].string + __n) = 0;
        ppSVar1 = cache->hashtable;
        pSVar5->next = ppSVar1[uVar3];
        ppSVar1[uVar3] = pSVar5;
        return pSVar5->string;
      }
      return (char *)0x0;
    }
    __s1 = pSVar8->string;
    iVar4 = strncmp(__s1,str,__n);
    if ((iVar4 == 0) && (__s1[__n] == '\0')) {
      if (pSVar5 != (StringBucket *)0x0) {
        if (pSVar5->next != pSVar8) {
          __assert_fail("prev->next == bucket",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                        ,0x173,
                        "const char *stringcache_len_internal(StringCache *, const char *, const unsigned int, const int)"
                       );
        }
        pSVar5->next = pSVar8->next;
        ppSVar1 = cache->hashtable;
        pSVar8->next = ppSVar1[uVar3];
        ppSVar1[uVar3] = pSVar8;
      }
      bVar2 = false;
      pSVar7 = pSVar8;
      local_48 = __s1;
    }
    else {
      bVar2 = true;
      pSVar7 = pSVar8->next;
      pSVar5 = pSVar8;
    }
    pSVar8 = pSVar7;
  } while (bVar2);
  return local_48;
}

Assistant:

static const char *stringcache_len_internal(StringCache *cache,
                                            const char *str,
                                            const unsigned int len,
                                            const int addmissing)
{
    const uint8 hash = hash_string(str, len) & (cache->table_size-1);
    StringBucket *bucket = cache->hashtable[hash];
    StringBucket *prev = NULL;
    while (bucket)
    {
        const char *bstr = bucket->string;
        if ((strncmp(bstr, str, len) == 0) && (bstr[len] == 0))
        {
            // Matched! Move this to the front of the list.
            if (prev != NULL)
            {
                assert(prev->next == bucket);
                prev->next = bucket->next;
                bucket->next = cache->hashtable[hash];
                cache->hashtable[hash] = bucket;
            } // if
            return bstr; // already cached
        } // if
        prev = bucket;
        bucket = bucket->next;
    } // while

    // no match!
    if (!addmissing)
        return NULL;

    // add to the table.
    bucket = (StringBucket *) cache->m(sizeof (StringBucket) + len + 1, cache->d);
    if (bucket == NULL)
        return NULL;
    bucket->string = (char *)(bucket + 1);
    memcpy(bucket->string, str, len);
    bucket->string[len] = '\0';
    bucket->next = cache->hashtable[hash];
    cache->hashtable[hash] = bucket;
    return bucket->string;
}